

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *printer)

{
  Options *options;
  Options *extraout_RDX;
  string local_150;
  NamespaceOpener ns;
  Formatter format;
  CrossFileReferences refs;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  refs.weak_default_instances._M_h._M_buckets = &refs.weak_default_instances._M_h._M_single_bucket;
  options = (Options *)0x1;
  refs.weak_default_instances._M_h._M_bucket_count = 1;
  refs.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_default_instances._M_h._M_element_count = 0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_default_instances._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.strong_reflection_files._M_h._M_buckets = &refs.strong_reflection_files._M_h._M_single_bucket
  ;
  refs.strong_reflection_files._M_h._M_bucket_count = 1;
  refs.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.strong_reflection_files._M_h._M_element_count = 0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.strong_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.weak_reflection_files._M_h._M_buckets = &refs.weak_reflection_files._M_h._M_single_bucket;
  refs.weak_reflection_files._M_h._M_bucket_count = 1;
  refs.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_reflection_files._M_h._M_element_count = 0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ns.name_stack_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&refs;
  ns.printer_ = (Printer *)this;
  ForEachField<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
            (*(Descriptor **)
              (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[idx]._M_t.
              super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
              ._M_t,(anon_class_16_2_3fe543fb *)&ns);
  GenerateInternalForwardDeclarations(this,&refs,printer);
  Namespace_abi_cxx11_(&local_150,(cpp *)this->file_,(FileDescriptor *)&this->options_,options);
  NamespaceOpener::NamespaceOpener(&ns,&local_150,&format);
  std::__cxx11::string::~string((string *)&local_150);
  GenerateSourceDefaultInstance(this,idx,printer);
  Formatter::operator()<>(&format,"\n");
  MessageGenerator::GenerateClassMethods
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[idx]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,printer);
  Formatter::operator()<>(&format,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener(&ns);
  ProtobufNamespace_abi_cxx11_(&local_150,(cpp *)&this->options_,extraout_RDX);
  NamespaceOpener::NamespaceOpener(&ns,&local_150,&format);
  std::__cxx11::string::~string((string *)&local_150);
  MessageGenerator::GenerateSourceInProto2Namespace
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[idx]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,printer);
  NamespaceOpener::~NamespaceOpener(&ns);
  Formatter::operator()<>(&format,"\n// @@protoc_insertion_point(global_scope)\n");
  CrossFileReferences::~CrossFileReferences(&refs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);

  CrossFileReferences refs;
  ForEachField(message_generators_[idx]->descriptor_,
               [this, &refs](const FieldDescriptor* field) {
                 GetCrossFileReferencesForField(field, &refs);
               });
  GenerateInternalForwardDeclarations(refs, printer);

  {  // package namespace
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    GenerateSourceDefaultInstance(idx, printer);

    // Generate classes.
    format("\n");
    message_generators_[idx]->GenerateClassMethods(printer);

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }  // end package namespace

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    message_generators_[idx]->GenerateSourceInProto2Namespace(printer);
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}